

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

undefined8 __thiscall indigox::Element::ToString_abi_cxx11_(Element *this)

{
  ostream *poVar1;
  string *in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,in_RSI);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::operator<<(poVar1,in_RSI + 0x20);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

String Element::ToString() const {
    std::stringstream ss;
    ss << name_ << " (" << symbol_ << ")";
    return ss.str();
  }